

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall crnlib::dxt_image::unpack(dxt_image *this,image_u8 *img)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  color_quad<unsigned_char,_int> *this_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  long in_RDI;
  color_quad_u8 *in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  dxt_image *in_stack_00000020;
  uint i_1;
  uint ix;
  uint x;
  uint iy;
  uint y;
  uint limit_x;
  uint pixel_ofs_x;
  uint block_x;
  uint limit_y;
  uint pixel_ofs_y;
  uint block_y;
  bool all_blocks_valid;
  uint i;
  color_quad_u8 pixels [16];
  undefined1 in_stack_ffffffffffffff1b;
  uint in_stack_ffffffffffffff1c;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  color_quad<unsigned_char,_int> *pcVar5;
  color_quad<unsigned_char,_int> *local_b0;
  uint local_9c;
  uint local_94;
  uint local_8c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar6;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff8c;
  uint uVar8;
  uint in_stack_ffffffffffffff90;
  uint uVar9;
  uint in_stack_ffffffffffffff94;
  uint uVar10;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffff98;
  color_quad<unsigned_char,_int> acStack_28 [2];
  bool local_1;
  
  if (*(int *)(in_RDI + 0x2c) == 0) {
    local_1 = false;
  }
  else {
    color_quad<unsigned_char,_int>::make_black();
    image<crnlib::color_quad<unsigned_char,_int>_>::resize
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c,
               (color_quad<unsigned_char,_int> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    pcVar5 = (color_quad<unsigned_char,_int> *)&stack0xffffffffffffff98;
    do {
      local_b0 = pcVar5;
      color_quad<unsigned_char,_int>::color_quad(local_b0);
      pcVar5 = local_b0 + 1;
    } while (local_b0 + 1 != acStack_28);
    for (uVar10 = 0; uVar10 < 0x10; uVar10 = uVar10 + 1) {
      color_quad<unsigned_char,_int>::set
                (local_b0,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                 (int)in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                 (int)in_stack_ffffffffffffff20);
    }
    uVar9 = 0x1000000;
    uVar10 = 0;
    while (uVar10 < *(uint *)(in_RDI + 0x24)) {
      uVar8 = uVar10;
      uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(in_RSI);
      uVar3 = math::minimum<unsigned_int>(4,uVar2 + uVar10 * -4);
      uVar6 = 0;
      while (uVar6 < *(uint *)(in_RDI + 0x20)) {
        bVar1 = get_block_pixels(in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                                 in_stack_00000010);
        if (!bVar1) {
          uVar9 = 0;
        }
        uVar7 = uVar6;
        uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(in_RSI);
        uVar4 = math::minimum<unsigned_int>(4,uVar2 + uVar6 * -4);
        for (local_8c = 0; local_8c < uVar3; local_8c = local_8c + 1) {
          for (local_94 = 0; local_94 < uVar4; local_94 = local_94 + 1) {
            pcVar5 = (color_quad<unsigned_char,_int> *)
                     (&stack0xffffffffffffff98 + (ulong)(local_94 + local_8c * 4) * 4);
            this_00 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                                (in_RSI,uVar6 * 4 + local_94,uVar10 * 4 + local_8c);
            color_quad<unsigned_char,_int>::operator=(this_00,pcVar5);
          }
        }
        uVar6 = uVar7 + 1;
      }
      uVar10 = uVar8 + 1;
    }
    if ((uVar9 & 0x1000000) == 0) {
      console::error("dxt_image::unpack: One or more invalid blocks encountered!");
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::reset_comp_flags(in_RSI);
    image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b);
    image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b);
    image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b);
    for (local_9c = 0; local_9c < *(uint *)(in_RDI + 0x30); local_9c = local_9c + 1) {
      if (*(char *)(in_RDI + 0x38 + (ulong)local_9c) < '\0') {
        image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                   (bool)in_stack_ffffffffffffff1b);
        image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                   (bool)in_stack_ffffffffffffff1b);
        image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                   (bool)in_stack_ffffffffffffff1b);
      }
      else {
        image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                   (bool)in_stack_ffffffffffffff1b);
      }
    }
    get_dxt_format_has_alpha(*(dxt_format *)(in_RDI + 0x44));
    image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
              (in_RSI,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dxt_image::unpack(image_u8& img) const {
  if (!m_total_elements)
    return false;

  img.resize(m_width, m_height);

  color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];
  for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
    pixels[i].set(0, 0, 0, 255);

  bool all_blocks_valid = true;
  for (uint block_y = 0; block_y < m_blocks_y; block_y++) {
    const uint pixel_ofs_y = block_y * cDXTBlockSize;
    const uint limit_y = math::minimum<uint>(cDXTBlockSize, img.get_height() - pixel_ofs_y);

    for (uint block_x = 0; block_x < m_blocks_x; block_x++) {
      if (!get_block_pixels(block_x, block_y, pixels))
        all_blocks_valid = false;

      const uint pixel_ofs_x = block_x * cDXTBlockSize;

      const uint limit_x = math::minimum<uint>(cDXTBlockSize, img.get_width() - pixel_ofs_x);

      for (uint y = 0; y < limit_y; y++) {
        const uint iy = pixel_ofs_y + y;

        for (uint x = 0; x < limit_x; x++) {
          const uint ix = pixel_ofs_x + x;

          img(ix, iy) = pixels[x + (y << cDXTBlockShift)];
        }
      }
    }
  }

  if (!all_blocks_valid)
    console::error("dxt_image::unpack: One or more invalid blocks encountered!");

  img.reset_comp_flags();
  img.set_component_valid(0, false);
  img.set_component_valid(1, false);
  img.set_component_valid(2, false);
  for (uint i = 0; i < m_num_elements_per_block; i++) {
    if (m_element_component_index[i] < 0) {
      img.set_component_valid(0, true);
      img.set_component_valid(1, true);
      img.set_component_valid(2, true);
    } else
      img.set_component_valid(m_element_component_index[i], true);
  }

  img.set_component_valid(3, get_dxt_format_has_alpha(m_format));

  return true;
}